

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf_common.cpp
# Opt level: O1

double sum_cnt(vector<Triplet,_std::allocator<Triplet>_> *data_vec)

{
  pointer pTVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  
  pTVar1 = (data_vec->super__Vector_base<Triplet,_std::allocator<Triplet>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(data_vec->super__Vector_base<Triplet,_std::allocator<Triplet>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pTVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 4;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    pdVar2 = &pTVar1->cnt;
    dVar4 = 0.0;
    do {
      dVar4 = dVar4 + *pdVar2;
      pdVar2 = pdVar2 + 2;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    return dVar4;
  }
  return 0.0;
}

Assistant:

double sum_cnt(vector<Triplet> &data_vec) {
    double sum = 0;
    for (int i = 0; i < data_vec.size(); i++) {
        sum += data_vec[i].cnt;
    }
    return sum;
}